

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void simple_epollin_impl(_func_void_int_ptr *fd_fun)

{
  int iVar1;
  int iVar2;
  undefined1 local_39 [8];
  epoll_event event_result;
  uint8_t data;
  epoll_event event;
  int fds [3];
  int ep;
  _func_void_int_ptr *fd_fun_local;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1a0,"ep >= 0");
  }
  (*fd_fun)((int *)&event.data);
  event_result.data.u64._1_4_ = 1;
  stack0xffffffffffffffd8 = event.data.fd;
  iVar2 = epoll_ctl(iVar1,1,event.data.fd,(epoll_event *)((long)&event_result.data + 1));
  if (iVar2 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1a9,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0");
  }
  event_result.data.fd._0_1_ = 0;
  write(event.data.u64._4_4_,&event_result.data,1);
  iVar2 = epoll_wait(iVar1,(epoll_event *)local_39,1,-1);
  if (iVar2 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1af,"epoll_wait(ep, &event_result, 1, -1) == 1");
  }
  if (local_39._4_4_ != event.data.fd) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1b1,"event_result.data.fd == fds[0]");
  }
  iVar2 = close(event.data.fd);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1b3,"close(fds[0]) == 0");
  }
  iVar2 = close(event.data.u64._4_4_);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1b4,"close(fds[1]) == 0");
  }
  if (fds[0] != -1) {
    iVar2 = close(fds[0]);
    if (iVar2 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x1b5,"fds[2] == -1 || close(fds[2]) == 0");
    }
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1b6,"close(ep) == 0");
  }
  return;
}

Assistant:

static void
simple_epollin_impl(void (*fd_fun)(int fds[3]))
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_fun(fds);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = fds[0];

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0);

	uint8_t data = '\0';
	write(fds[1], &data, 1);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);

	ATF_REQUIRE(event_result.data.fd == fds[0]);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}